

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

CallInfo __thiscall
Js::JavascriptStackWalker::GetCallInfo(JavascriptStackWalker *this,bool includeInlinedFrames)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptFunction *pJVar4;
  void **ppvVar5;
  JavascriptGenerator *pJVar6;
  Entry *pEVar7;
  Type *pTVar8;
  
  if (((*(ushort *)&this->field_0x50 >> 2 | *(ushort *)&this->field_0x50) & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x435,"(this->IsJavascriptFrame())","this->IsJavascriptFrame()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((includeInlinedFrames) && ((this->field_0x50 & 1) != 0)) {
    pTVar8 = (Type *)&this->inlinedFrameCallInfo;
  }
  else {
    pJVar4 = GetCurrentFunction(this,true);
    if ((((pJVar4->functionInfo).ptr)->attributes & (Async|Generator)) == None) {
      if ((this->field_0x50 & 8) == 0) {
        pEVar7 = (Entry *)GetCurrentArgv(this);
      }
      else {
        pEVar7 = this->prevNativeLibraryEntry;
      }
      pTVar8 = (Type *)&pEVar7->callInfo;
    }
    else {
      ppvVar5 = GetCurrentArgv(this);
      pJVar6 = VarTo<Js::JavascriptGenerator>(ppvVar5[2]);
      pTVar8 = &pJVar6->args;
    }
  }
  return (CallInfo)((ulong)pTVar8->Info & 0xfffffffff7ffffff);
}

Assistant:

CallInfo JavascriptStackWalker::GetCallInfo(bool includeInlinedFrames /* = true */) const
    {
        Assert(this->IsJavascriptFrame());
        CallInfo callInfo;
        if (includeInlinedFrames && inlinedFramesBeingWalked)
        {
            // Since we don't support inlining constructors yet, its questionable if we should handle the
            // hidden frame display here?
            callInfo = inlinedFrameCallInfo;
        }
        else if (this->GetCurrentFunction()->GetFunctionInfo()->IsCoroutine())
        {
            JavascriptGenerator* gen = VarTo<JavascriptGenerator>(this->GetCurrentArgv()[JavascriptFunctionArgIndex_This]);
            callInfo = gen->GetArguments().Info;
        }
        else if (this->isNativeLibraryFrame)
        {
            // Return saved callInfo. Do not read from stack as compiler may stackpack/optimize args.
            callInfo = this->prevNativeLibraryEntry->callInfo;
        }
        else
        {
            callInfo = *(CallInfo const *)&this->GetCurrentArgv()[JavascriptFunctionArgIndex_CallInfo];
        }

        if (callInfo.Flags & Js::CallFlags_ExtraArg)
        {
            callInfo.Flags = (CallFlags)(callInfo.Flags & ~Js::CallFlags_ExtraArg);
        }

        return callInfo;
    }